

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

Array<asl::Xml> * __thiscall
asl::Array<asl::Xml>::operator=(Array<asl::Xml> *this,Array<asl::Xml> *b)

{
  Xml *pXVar1;
  
  if (this->_a != b->_a) {
    LOCK();
    pXVar1 = this->_a + -1;
    *(int *)&(pXVar1->super_NodeBase)._p = *(int *)&(pXVar1->super_NodeBase)._p + -1;
    UNLOCK();
    if (*(int *)&(pXVar1->super_NodeBase)._p == 0) {
      free(this,b);
    }
    pXVar1 = b->_a;
    this->_a = pXVar1;
    LOCK();
    pXVar1 = pXVar1 + -1;
    *(int *)&(pXVar1->super_NodeBase)._p = *(int *)&(pXVar1->super_NodeBase)._p + 1;
    UNLOCK();
  }
  return this;
}

Assistant:

Array& operator=(const Array& b)
	{
		if (_a == b._a)
			return *this;
		if(--d().rc==0) free();
		_a = b._a;
		++d().rc;
		return *this;
	}